

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O0

CURLcode add_file_name_to_url(CURL *curl,char **inurlp,char *filename)

{
  char *pcVar1;
  char *local_80;
  undefined8 local_78;
  char *newurl;
  char *newpath;
  char *encfile;
  char *file2;
  char *filep;
  char *ptr;
  char *query;
  char *path;
  CURLU *uh;
  CURLUcode uerr;
  CURLcode result;
  char *filename_local;
  char **inurlp_local;
  CURL *curl_local;
  
  uh._4_4_ = CURLE_URL_MALFORMAT;
  _uerr = filename;
  filename_local = (char *)inurlp;
  inurlp_local = (char **)curl;
  path = (char *)curl_url();
  query = (char *)0x0;
  ptr = (char *)0x0;
  if (path != (char *)0x0) {
    uh._0_4_ = curl_url_set(path,0,*(undefined8 *)filename_local,0x208);
    if ((CURLUcode)uh == CURLUE_OK) {
      uh._0_4_ = curl_url_get(path,7,&query,0);
      if ((CURLUcode)uh == CURLUE_OK) {
        uh._0_4_ = curl_url_get(path,8,&ptr,0);
        if (((CURLUcode)uh == CURLUE_OK) && (ptr != (char *)0x0)) {
          curl_free(ptr);
          curl_free(query);
          curl_url_cleanup(path);
          return CURLE_OK;
        }
        pcVar1 = strrchr(query,0x2f);
        filep = pcVar1;
        if ((pcVar1 == (char *)0x0) || (filep = pcVar1 + 1, pcVar1[1] == '\0')) {
          file2 = strrchr(_uerr,0x2f);
          local_80 = file2;
          if (file2 == (char *)0x0) {
            local_80 = _uerr;
          }
          encfile = strrchr(local_80,0x5c);
          if (encfile == (char *)0x0) {
            if (file2 == (char *)0x0) {
              file2 = _uerr;
            }
            else {
              file2 = file2 + 1;
            }
          }
          else {
            file2 = encfile + 1;
          }
          newpath = (char *)curl_easy_escape(inurlp_local,file2,0);
          if (newpath != (char *)0x0) {
            if (filep == (char *)0x0) {
              newurl = (char *)curl_maprintf("%s/%s",query,newpath);
            }
            else {
              newurl = (char *)curl_maprintf("%s%s",query,newpath);
            }
            curl_free(newpath);
            if (newurl != (char *)0x0) {
              uh._0_4_ = curl_url_set(path,7,newurl,0);
              free(newurl);
              if ((CURLUcode)uh == CURLUE_OK) {
                uh._0_4_ = curl_url_get(path,0,&local_78,4);
                if ((CURLUcode)uh == CURLUE_OK) {
                  free(*(void **)filename_local);
                  *(undefined8 *)filename_local = local_78;
                  uh._4_4_ = CURLE_OK;
                }
                else {
                  uh._4_4_ = urlerr_cvt((CURLUcode)uh);
                }
              }
              else {
                uh._4_4_ = urlerr_cvt((CURLUcode)uh);
              }
            }
          }
        }
        else {
          uh._4_4_ = CURLE_OK;
        }
      }
      else {
        uh._4_4_ = urlerr_cvt((CURLUcode)uh);
      }
    }
    else {
      uh._4_4_ = urlerr_cvt((CURLUcode)uh);
    }
  }
  curl_url_cleanup(path);
  curl_free(query);
  return uh._4_4_;
}

Assistant:

CURLcode add_file_name_to_url(CURL *curl, char **inurlp, const char *filename)
{
  CURLcode result = CURLE_URL_MALFORMAT;
  CURLUcode uerr;
  CURLU *uh = curl_url();
  char *path = NULL;
  char *query = NULL;
  if(uh) {
    char *ptr;
    uerr = curl_url_set(uh, CURLUPART_URL, *inurlp,
                    CURLU_GUESS_SCHEME|CURLU_NON_SUPPORT_SCHEME);
    if(uerr) {
      result = urlerr_cvt(uerr);
      goto fail;
    }
    uerr = curl_url_get(uh, CURLUPART_PATH, &path, 0);
    if(uerr) {
      result = urlerr_cvt(uerr);
      goto fail;
    }
    uerr = curl_url_get(uh, CURLUPART_QUERY, &query, 0);
    if(!uerr && query) {
      curl_free(query);
      curl_free(path);
      curl_url_cleanup(uh);
      return CURLE_OK;
    }
    ptr = strrchr(path, '/');
    if(!ptr || !*++ptr) {
      /* The URL path has no filename part, add the local filename. In order
         to be able to do so, we have to create a new URL in another buffer.*/

      /* We only want the part of the local path that is on the right
         side of the rightmost slash and backslash. */
      const char *filep = strrchr(filename, '/');
      char *file2 = strrchr(filep ? filep : filename, '\\');
      char *encfile;

      if(file2)
        filep = file2 + 1;
      else if(filep)
        filep++;
      else
        filep = filename;

      /* URL encode the filename */
      encfile = curl_easy_escape(curl, filep, 0 /* use strlen */);
      if(encfile) {
        char *newpath;
        char *newurl;
        if(ptr)
          /* there is a trailing slash on the path */
          newpath = aprintf("%s%s", path, encfile);
        else
          /* there is no trailing slash on the path */
          newpath = aprintf("%s/%s", path, encfile);

        curl_free(encfile);

        if(!newpath)
          goto fail;
        uerr = curl_url_set(uh, CURLUPART_PATH, newpath, 0);
        free(newpath);
        if(uerr) {
          result = urlerr_cvt(uerr);
          goto fail;
        }
        uerr = curl_url_get(uh, CURLUPART_URL, &newurl, CURLU_DEFAULT_SCHEME);
        if(uerr) {
          result = urlerr_cvt(uerr);
          goto fail;
        }
        free(*inurlp);
        *inurlp = newurl;
        result = CURLE_OK;
      }
    }
    else
      /* nothing to do */
      result = CURLE_OK;
  }
fail:
  curl_url_cleanup(uh);
  curl_free(path);
  return result;
}